

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

bool ON_Font::EqualStyle(ON_Font *lhs,ON_Font *rhs,bool bUnsetIsEqual)

{
  if (rhs != (ON_Font *)0x0 && lhs != (ON_Font *)0x0) {
    if ((lhs->m_font_style == rhs->m_font_style) ||
       ((bUnsetIsEqual && (lhs->m_font_style == Unset || rhs->m_font_style == Unset)))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Font::EqualStyle(
  const ON_Font* lhs,
  const ON_Font* rhs,
  bool bUnsetIsEqual
)
{
  if (nullptr == lhs || nullptr == rhs)
    return false;
  if (lhs->m_font_style != rhs->m_font_style)
  {
    if (false == bUnsetIsEqual)
      return false;
    if (ON_Font::Style::Unset != lhs->m_font_style && ON_Font::Style::Unset != rhs->m_font_style)
      return false;
  }
  return true;
}